

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseDecoder.cpp
# Opt level: O1

void __thiscall
siamese::RecoveryMatrixState::ResumeGE(RecoveryMatrixState *this,uint oldRows,uint rows)

{
  uint8_t *vx;
  uint8_t uVar1;
  uint8_t y;
  uint uVar2;
  uint uVar3;
  RowInfo *pRVar4;
  uint uVar5;
  uint uVar6;
  uint8_t *puVar7;
  ulong local_48;
  
  if ((oldRows < rows) && (this->GEResumePivot != 0)) {
    uVar2 = (this->Matrix).AllocatedColumns;
    local_48 = (ulong)(uVar2 * oldRows);
    uVar5 = 0;
    do {
      local_48 = local_48 + 1;
      if (oldRows < rows) {
        uVar6 = (this->Pivots).DataPtr[(int)uVar5];
        uVar3 = (this->Rows).DataPtr[(int)uVar6].MatrixColumnCount;
        puVar7 = (this->Matrix).Data;
        vx = puVar7 + (ulong)uVar5 + 1 + (ulong)(uVar2 * uVar6);
        uVar1 = vx[-1];
        puVar7 = puVar7 + local_48;
        uVar6 = oldRows;
        do {
          if (puVar7[-1] != '\0') {
            y = GF256Ctx.GF256_DIV_TABLE[CONCAT11(uVar1,puVar7[-1])];
            puVar7[-1] = y;
            gf256_muladd_mem(puVar7,y,vx,~uVar5 + uVar3);
            pRVar4 = (this->Rows).DataPtr;
            if (pRVar4[(int)uVar6].MatrixColumnCount < uVar3) {
              pRVar4[(int)uVar6].MatrixColumnCount = uVar3;
            }
          }
          uVar6 = uVar6 + 1;
          puVar7 = puVar7 + uVar2;
        } while (rows != uVar6);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < this->GEResumePivot);
  }
  return;
}

Assistant:

void RecoveryMatrixState::ResumeGE(const unsigned oldRows, const unsigned rows)
{
    // If we did not add any new rows:
    if (oldRows >= rows)
    {
        SIAMESE_DEBUG_ASSERT(oldRows == rows);
        return;
    }

    const unsigned stride = Matrix.AllocatedColumns;

    // For each pivot we have determined already:
    for (unsigned pivot_i = 0; pivot_i < GEResumePivot; ++pivot_i)
    {
        // Get the row for that pivot
        const unsigned matrixRowIndex_i = Pivots.GetRef(pivot_i);
        const uint8_t* ge_row = Matrix.Data + stride * matrixRowIndex_i;
        const uint8_t val_i   = ge_row[pivot_i];
        SIAMESE_DEBUG_ASSERT(val_i != 0);

        const unsigned pivotColumnCount = Rows.GetRef(matrixRowIndex_i).MatrixColumnCount;

        uint8_t* rem_row = Matrix.Data + stride * oldRows;

        // For each new row that was added:
        for (unsigned newRowIndex = oldRows; newRowIndex < rows; ++newRowIndex, rem_row += stride)
        {
            if (EliminateRow(ge_row, rem_row, pivot_i, pivotColumnCount, val_i))
            {
                // Grow the column count of this row if we just filled it in on the right
                if (Rows.GetRef(newRowIndex).MatrixColumnCount < pivotColumnCount)
                    Rows.GetRef(newRowIndex).MatrixColumnCount = pivotColumnCount;
            }
            SIAMESE_DEBUG_ASSERT(Pivots.GetRef(newRowIndex) == newRowIndex);
        }
    }
}